

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void vec_gen_op3(TCGContext_conflict9 *tcg_ctx,TCGOpcode opc,uint vece,TCGv_vec r,TCGv_vec a,
                TCGv_vec b)

{
  undefined8 uVar1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGArg r_00;
  TCGArg a_00;
  TCGArg b_00;
  TCGType_conflict type;
  TCGTemp *bt;
  TCGTemp *at;
  TCGTemp *rt;
  TCGv_vec b_local;
  TCGv_vec a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGOpcode opc_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  ts = tcgv_vec_temp(tcg_ctx,r);
  ts_00 = tcgv_vec_temp(tcg_ctx,a);
  ts_01 = tcgv_vec_temp(tcg_ctx,b);
  uVar1 = *(undefined8 *)ts;
  r_00 = temp_arg(ts);
  a_00 = temp_arg(ts_00);
  b_00 = temp_arg(ts_01);
  vec_gen_3_tricore(tcg_ctx,opc,(TCGType_conflict)((ulong)uVar1 >> 0x10) & 0xff,vece,r_00,a_00,b_00)
  ;
  return;
}

Assistant:

static void vec_gen_op3(TCGContext *tcg_ctx, TCGOpcode opc, unsigned vece,
                        TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGTemp *bt = tcgv_vec_temp(tcg_ctx, b);
    TCGType type = rt->base_type;

    /* Must enough inputs for the output.  */
    tcg_debug_assert(at->base_type >= type);
    tcg_debug_assert(bt->base_type >= type);
    vec_gen_3(tcg_ctx, opc, type, vece, temp_arg(rt), temp_arg(at), temp_arg(bt));
}